

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_d_d_ea(m68k_info *info,int opcode,int size)

{
  uint instruction;
  cs_m68k *pcVar1;
  cs_m68k *ext;
  uint extension;
  cs_m68k_op *op2;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  m68k_info *in_stack_ffffffffffffffe0;
  
  instruction = read_imm_16((m68k_info *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  pcVar1 = build_init_op(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                         (int)in_stack_ffffffffffffffd8,instruction);
  pcVar1->operands[0].address_mode = M68K_AM_REG_DIRECT_DATA;
  pcVar1->operands[0].field_0.reg = (instruction & 7) + M68K_REG_D0;
  pcVar1->operands[1].address_mode = M68K_AM_REG_DIRECT_DATA;
  *(uint *)&((m68k_info *)(pcVar1->operands + 1))->code = (instruction >> 6 & 7) + 1;
  get_ea_mode_op((m68k_info *)(pcVar1->operands + 1),pcVar1->operands + 2,instruction,
                 in_stack_ffffffffffffffd0);
  return;
}

Assistant:

static void build_d_d_ea(m68k_info *info, int opcode, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k_op* op2;
	uint extension = read_imm_16(info);
	cs_m68k* ext = build_init_op(info, opcode, 3, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];
	op2 = &ext->operands[2];

	op0->address_mode = M68K_AM_REG_DIRECT_DATA;
	op0->reg = M68K_REG_D0 + (extension & 7);

	op1->address_mode = M68K_AM_REG_DIRECT_DATA;
	op1->reg = M68K_REG_D0 + ((extension >> 6) & 7);

	get_ea_mode_op(info, op2, info->ir, size);
}